

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS ref_part_by_extension(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  int iVar1;
  size_t sVar2;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  size_t end_of_string;
  char *filename_local;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  sVar2 = strlen(filename);
  if ((sVar2 < 0xb) || (iVar1 = strcmp(filename + (sVar2 - 10),".lb8.ugrid"), iVar1 != 0)) {
    if ((sVar2 < 10) || (iVar1 = strcmp(filename + (sVar2 - 9),".b8.ugrid"), iVar1 != 0)) {
      if ((sVar2 < 0xc) || (iVar1 = strcmp(filename + (sVar2 - 0xb),".lb8l.ugrid"), iVar1 != 0)) {
        if ((sVar2 < 0xb) || (iVar1 = strcmp(filename + (sVar2 - 10),".b8l.ugrid"), iVar1 != 0)) {
          if ((sVar2 < 0xd) || (iVar1 = strcmp(filename + (sVar2 - 0xc),".lb8.ugrid64"), iVar1 != 0)
             ) {
            if ((sVar2 < 0xc) ||
               (iVar1 = strcmp(filename + (sVar2 - 0xb),".b8.ugrid64"), iVar1 != 0)) {
              if ((sVar2 < 7) || (iVar1 = strcmp(filename + (sVar2 - 6),".meshb"), iVar1 != 0)) {
                if ((sVar2 < 5) || (iVar1 = strcmp(filename + (sVar2 - 4),".avm"), iVar1 != 0)) {
                  printf("%s: %d: %s %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xd0c,"input file name extension unknown",filename);
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xd0e,"ref_part_by_extension",1,"unknown file extension");
                  ref_grid_ptr_local._4_4_ = 1;
                }
                else {
                  ref_grid_ptr_local._4_4_ = ref_part_avm(ref_grid_ptr,ref_mpi,filename);
                  if (ref_grid_ptr_local._4_4_ == 0) {
                    ref_grid_ptr_local._4_4_ = 0;
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0xd09,"ref_part_by_extension",(ulong)ref_grid_ptr_local._4_4_,
                           "avm failed");
                  }
                }
              }
              else {
                ref_grid_ptr_local._4_4_ = ref_part_meshb(ref_grid_ptr,ref_mpi,filename);
                if (ref_grid_ptr_local._4_4_ == 0) {
                  ref_grid_ptr_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xd05,"ref_part_by_extension",(ulong)ref_grid_ptr_local._4_4_,
                         "meshb failed");
                }
              }
            }
            else {
              ref_grid_ptr_local._4_4_ = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,1,1);
              if (ref_grid_ptr_local._4_4_ == 0) {
                ref_grid_ptr_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xd00,"ref_part_by_extension",(ulong)ref_grid_ptr_local._4_4_,
                       "b8_ugrid failed");
              }
            }
          }
          else {
            ref_grid_ptr_local._4_4_ = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,0,1);
            if (ref_grid_ptr_local._4_4_ == 0) {
              ref_grid_ptr_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xcfa,"ref_part_by_extension",(ulong)ref_grid_ptr_local._4_4_,
                     "lb8_ugrid failed");
            }
          }
        }
        else {
          ref_grid_ptr_local._4_4_ = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,1,1);
          if (ref_grid_ptr_local._4_4_ == 0) {
            ref_grid_ptr_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0xcf3,"ref_part_by_extension",(ulong)ref_grid_ptr_local._4_4_,"b8_ugrid failed");
          }
        }
      }
      else {
        ref_grid_ptr_local._4_4_ = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,0,1);
        if (ref_grid_ptr_local._4_4_ == 0) {
          ref_grid_ptr_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0xced,"ref_part_by_extension",(ulong)ref_grid_ptr_local._4_4_,"lb8_ugrid failed");
        }
      }
    }
    else {
      ref_grid_ptr_local._4_4_ = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,1,0);
      if (ref_grid_ptr_local._4_4_ == 0) {
        ref_grid_ptr_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0xce6,"ref_part_by_extension",(ulong)ref_grid_ptr_local._4_4_,"b8_ugrid failed");
      }
    }
  }
  else {
    ref_grid_ptr_local._4_4_ = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,0,0);
    if (ref_grid_ptr_local._4_4_ == 0) {
      ref_grid_ptr_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xcdf,
             "ref_part_by_extension",(ulong)ref_grid_ptr_local._4_4_,"lb8_ugrid failed");
    }
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_part_by_extension(REF_GRID *ref_grid_ptr,
                                         REF_MPI ref_mpi,
                                         const char *filename) {
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (end_of_string > 10 &&
      strcmp(&filename[end_of_string - 10], ".lb8.ugrid") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                           REF_FALSE),
        "lb8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 9 &&
      strcmp(&filename[end_of_string - 9], ".b8.ugrid") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE,
                           REF_FALSE),
        "b8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 11 &&
      strcmp(&filename[end_of_string - 11], ".lb8l.ugrid") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                           REF_TRUE),
        "lb8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 10 &&
      strcmp(&filename[end_of_string - 10], ".b8l.ugrid") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE, REF_TRUE),
        "b8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 12 &&
      strcmp(&filename[end_of_string - 12], ".lb8.ugrid64") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                           REF_TRUE),
        "lb8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 11 &&
      strcmp(&filename[end_of_string - 11], ".b8.ugrid64") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE, REF_TRUE),
        "b8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 6 &&
      strcmp(&filename[end_of_string - 6], ".meshb") == 0) {
    RSS(ref_part_meshb(ref_grid_ptr, ref_mpi, filename), "meshb failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".avm") == 0) {
    RSS(ref_part_avm(ref_grid_ptr, ref_mpi, filename), "avm failed");
    return REF_SUCCESS;
  }
  printf("%s: %d: %s %s\n", __FILE__, __LINE__,
         "input file name extension unknown", filename);
  RSS(REF_FAILURE, "unknown file extension");
  return REF_FAILURE;
}